

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  ushort uVar1;
  ushort uVar2;
  BVStatic<256UL> *this_00;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  uint uVar7;
  uint index;
  BVIndex BVar8;
  BVIndex BVar9;
  ushort local_34;
  
  uVar1 = this->objectCount;
  uVar2 = this->objectSize;
  this_00 = this->markBits;
  if (0x2000 < uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x78e,"(localObjectSize <= HeapConstants::MaxMediumObjectSize)",
                       "localObjectSize <= HeapConstants::MaxMediumObjectSize");
    if (!bVar4) goto LAB_006afded;
    *puVar5 = 0;
  }
  if (uVar1 == 0) {
    local_34 = 0;
    BVar9 = 0;
  }
  else {
    uVar7 = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    BVar8 = 0;
    BVar9 = 0;
    index = 0;
    local_34 = 0;
    do {
      pbVar6 = ObjectInfo(this,index);
      if ((*pbVar6 & 8) != 0) {
        if (0xfff < uVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                             ,0x7a0,"(index < TBlockAttributes::PageCount)",
                             "index < TBlockAttributes::PageCount");
          if (!bVar4) goto LAB_006afded;
          *puVar5 = 0;
        }
        local_34 = local_34 + 1;
        BVStatic<256UL>::Set(this_00,BVar8);
        BVar9 = BVar9 + 1;
      }
      index = index + 1;
      BVar8 = BVar8 + (uVar2 >> 4);
      uVar7 = uVar7 + uVar2;
    } while (uVar1 != index);
  }
  BVar8 = BVStatic<256UL>::Count(this_00);
  if (BVar8 != BVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x7a9,"(mark->Count() == localMarkCount)","mark->Count() == localMarkCount")
    ;
    if (!bVar4) {
LAB_006afded:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this->markCount = (ushort)BVar9;
  HeapBlockMap64::SetPageMarkCount
            (&this->heapBucket->heapInfo->recycler->heapBlockMap,(this->super_HeapBlock).address,
             local_34);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::MarkImplicitRoots()
{
    uint localObjectCount = this->GetObjectCount();
    uint localObjectBitDelta = this->GetObjectBitDelta();
    uint localMarkCount = 0;
    SmallHeapBlockBitVector * mark = this->GetMarkedBitVector();

#if DBG
    uint localObjectSize = this->GetObjectSize();
    Assert(localObjectSize <= HeapConstants::MaxMediumObjectSize);

    ushort markCountPerPage[TBlockAttributes::PageCount];
    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        markCountPerPage[i] = 0;
    }
#endif

    for (uint i = 0; i < localObjectCount; i++)
    {
        // REVIEW: This may include free object.  It is okay to mark them and scan them
        // But kind inefficient.
        if (this->ObjectInfo(i) & ImplicitRootBit)
        {
#if DBG
            {
                int index = (i * localObjectSize) / AutoSystemInfo::PageSize;
                Assert(index < TBlockAttributes::PageCount);
                markCountPerPage[index]++;
            }
#endif

            mark->Set(localObjectBitDelta * i);
            localMarkCount++;
        }
    }
    Assert(mark->Count() == localMarkCount);
    this->markCount = (ushort)localMarkCount;
#if DBG
    HeapBlockMap& map = this->GetRecycler()->heapBlockMap;

    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        map.SetPageMarkCount(this->address + (i * AutoSystemInfo::PageSize), markCountPerPage[i]);
    }
#endif
}